

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O0

void __thiscall
asio::detail::epoll_reactor::
cancel_timer_by_key<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,per_timer_data *timer,void *cancellation_key)

{
  scheduler *in_RCX;
  per_timer_data *in_RDX;
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  *in_RSI;
  conditionally_enabled_mutex *in_RDI;
  op_queue<asio::detail::scheduler_operation> ops;
  scoped_lock lock;
  op_queue<asio::detail::scheduler_operation> *in_stack_ffffffffffffffb0;
  op_queue<asio::detail::scheduler_operation> *in_stack_ffffffffffffffd8;
  
  conditionally_enabled_mutex::scoped_lock::scoped_lock
            ((scoped_lock *)in_stack_ffffffffffffffb0,in_RDI);
  op_queue<asio::detail::scheduler_operation>::op_queue(in_stack_ffffffffffffffb0);
  timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
  ::cancel_timer_by_key
            (in_RSI,in_RDX,(op_queue<asio::detail::scheduler_operation> *)in_RCX,
             in_stack_ffffffffffffffd8);
  conditionally_enabled_mutex::scoped_lock::unlock((scoped_lock *)in_stack_ffffffffffffffb0);
  scheduler::post_deferred_completions(in_RCX,in_stack_ffffffffffffffd8);
  op_queue<asio::detail::scheduler_operation>::~op_queue(in_stack_ffffffffffffffb0);
  conditionally_enabled_mutex::scoped_lock::~scoped_lock((scoped_lock *)in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void epoll_reactor::cancel_timer_by_key(timer_queue<Time_Traits>& queue,
    typename timer_queue<Time_Traits>::per_timer_data* timer,
    void* cancellation_key)
{
  mutex::scoped_lock lock(mutex_);
  op_queue<operation> ops;
  queue.cancel_timer_by_key(timer, ops, cancellation_key);
  lock.unlock();
  scheduler_.post_deferred_completions(ops);
}